

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O3

bool __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
add<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
          (DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *this,IntervalT *I,
          set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
          *vals)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  
  p_Var2 = (vals->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(vals->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    do {
      bVar1 = DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::_add
                        ((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)this,I,
                         (RWNode **)(p_Var2 + 1),false);
      bVar4 = (bool)(bVar4 | bVar1);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return bVar4;
}

Assistant:

bool add(const IntervalT &I, const ContT &vals) {
        bool changed = false;
        for (const ValueT &val : vals) {
            changed |= _add(I, val, false);
        }
        return changed;
    }